

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaLinkLineDeviceComputer.cxx
# Opt level: O2

string * __thiscall
cmNinjaLinkLineDeviceComputer::ConvertToLinkReference
          (string *__return_storage_ptr__,cmNinjaLinkLineDeviceComputer *this,string *lib)

{
  string *psVar1;
  
  psVar1 = cmGlobalNinjaGenerator::ConvertToNinjaPath(this->GG,lib);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaLinkLineDeviceComputer::ConvertToLinkReference(
  std::string const& lib) const
{
  return GG->ConvertToNinjaPath(lib);
}